

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Specific.hh
# Opt level: O1

void avro::
     codec_traits<std::vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>_>
     ::encode(Encoder *e,
             vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
             *b)

{
  pointer p_Var1;
  pointer p_Var2;
  
  (**(code **)(*(long *)e + 0x70))();
  p_Var2 = (b->
           super__Vector_base<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
           )._M_impl.super__Vector_impl_data._M_start;
  p_Var1 = (b->
           super__Vector_base<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (p_Var2 != p_Var1) {
    (**(code **)(*(long *)e + 0x90))(e,(long)p_Var1 - (long)p_Var2 >> 4);
    for (p_Var2 = (b->
                  super__Vector_base<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        p_Var2 != (b->
                  super__Vector_base<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
                  )._M_impl.super__Vector_impl_data._M_finish; p_Var2 = p_Var2 + 1) {
      (**(code **)(*(long *)e + 0x98))(e);
      encode<uau::_union_array_union_Union__0__>(e,p_Var2);
    }
  }
  (**(code **)(*(long *)e + 0x78))(e);
  return;
}

Assistant:

static void encode(Encoder& e, const std::vector<T>& b) {
        e.arrayStart();
        if (! b.empty()) {
            e.setItemCount(b.size());
            for (typename std::vector<T>::const_iterator it = b.begin();
                it != b.end(); ++it) {
                e.startItem();
                avro::encode(e, *it);
            }
        }
        e.arrayEnd();
    }